

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O2

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* wasm::ParamUtils::getUsedParams
            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *__return_storage_ptr__,Function *func,Module *module)

{
  map<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar1;
  pointer *ppuVar2;
  type *ptVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  pointer puVar4;
  __buckets_ptr pp_Var5;
  bool bVar6;
  size_t sVar7;
  size_type sVar8;
  _Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
  _Var9;
  __node_ptr p_Var10;
  _Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
  __node;
  pointer puVar11;
  Expression **ppEVar12;
  pointer puVar13;
  allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>
  *extraout_RDX;
  ulong uVar14;
  type tVar15;
  SetOfLocals *extraout_RDX_00;
  SetOfLocals *extraout_RDX_01;
  SetOfLocals *live_00;
  SetOfLocals *live_01;
  __node_base_ptr *pp_Var16;
  long lVar17;
  _Link_type __x_00;
  type *__n;
  BasicBlock **__arg;
  __node_base_ptr __arg_00;
  size_type in_R8;
  type __first;
  __normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
  _Var18;
  type *ptVar19;
  long lVar20;
  long *plVar21;
  type tVar22;
  long lVar23;
  BasicBlock *pBVar24;
  BasicBlock *pBVar25;
  pointer puVar26;
  undefined1 auStack_3e8 [8];
  ParamLiveness walker;
  type tStack_e8;
  SetOfLocals live;
  BasicBlock *curr;
  undefined1 local_b8 [8];
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  _Hash_node_base local_70;
  _Hash_node_base *p_Stack_68;
  size_type local_60;
  _Prime_rehash_policy _Stack_58;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  BasicBlock *local_40;
  type local_38;
  
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches;
  auStack_3e8 = (undefined1  [8])0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep = (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule = (Module *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pmVar1 = &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            debugIds;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
       _M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_48 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)__return_storage_ptr__;
  memset(&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ =
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
        _M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count =
       CONCAT44(walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                liveBlocks._M_h._M_element_count._4_4_,0x3f800000);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 copies.sparseStorage._M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_element_count._0_4_ = 0x3f800000;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_single_bucket._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.N = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies._84_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)module
  ;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  sVar7 = Function::getNumLocals(func);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_node_count._0_4_ = (uint32_t)sVar7;
  sparse_square_matrix<unsigned_char>::recreate
            ((sparse_square_matrix<unsigned_char> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              liveBlocks._M_h._M_single_bucket,
             (uint32_t)
             walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               copies._80_8_) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        copies._80_8_;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies
              .N,(ulong)(uint32_t)
                        walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                        .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pBVar25 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  __x_00 = (_Link_type)
           walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
           basicBlocks.
           super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((BasicBlock *)
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks
      .
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit) {
    std::
    _Destroy<std::unique_ptr<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock>>*,std::unique_ptr<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock>>>
              ((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .exit,walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                        .basicBlocks.
                        super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,extraout_RDX);
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar25;
  }
  std::
  _Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
              *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                debugIds._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x_00);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.catchIndexStack
  .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = '\0';
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::startBasicBlock
            ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
             auStack_3e8);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule =
       (Module *)
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
       super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems
             [9].currp >> 4) +
      (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                 );
  }
  Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::pushTask
            ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)auStack_3e8,
             CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::scan,
             &func->body);
  __n = (type *)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule;
  while (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start -
          (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                _M_elems[9].currp >> 4) +
         (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0) {
    if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                 _M_elems[9].currp ==
        walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
        super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep ==
          (Expression **)0x0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, 10>::back() [T = wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, N = 10]"
                     );
      }
      ppEVar12 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                 _M_elems[(long)walker.
                                super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                .
                                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                .
                                super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                                replacep + -2].currp;
      auStack_3e8 = (undefined1  [8])
                    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                    _M_elems[(long)walker.
                                   super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .
                                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                   .
                                   super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .replacep + -1].func;
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep =
           (Expression **)
           ((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep + -1);
    }
    else {
      ppEVar12 = (Expression **)
                 walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                 super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_3e8 = (undefined1  [8])
                    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
           super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
           super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_3e8 == (Expression *)0x0) {
      __assert_fail("*task.currp",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x132,
                    "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                   );
    }
    (*(code *)ppEVar12)((ParamLiveness *)auStack_3e8,(Expression **)auStack_3e8);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::doEndReturn
              ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
               auStack_3e8,(ParamLiveness *)0x0,
               (Expression **)
               walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\x01') {
    local_b8 = (undefined1  [8])
               walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               entry;
    std::
    vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                 *)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .exit,(value_type *)local_b8);
    std::
    unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
    ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                   *)local_b8);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x255,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("ifLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x256,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("loopLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,599,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      tryLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,600,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryLastBlockStack.
               super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("throwingInstsStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x259,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25a,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      processCatchStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("processCatchStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25b,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  queue._M_h._M_single_bucket = (__node_base_ptr)&_Stack_58._M_next_resize;
  local_70._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_68 = (_Hash_node_base *)0x0;
  local_60 = CONCAT44(local_60._4_4_,0x3f800000);
  _Stack_58._M_max_load_factor = 0.0;
  _Stack_58._4_4_ = 0;
  _Stack_58._M_next_resize = 0;
  local_b8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
  queue._M_h._M_buckets = (__buckets_ptr)0x1;
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  queue._M_h._M_element_count._0_4_ = 0x3f800000;
  queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  queue._M_h._M_rehash_policy._4_4_ = 0;
  queue._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            *)local_b8,(value_type *)__n);
  pp_Var16 = &queue._M_h._M_single_bucket;
  while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    puVar11 = *(pointer *)(queue._M_h._M_bucket_count + 8);
    live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = puVar11;
    std::
    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
             *)local_b8,(iterator)queue._M_h._M_bucket_count);
    __n = (type *)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::
    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
              *)pp_Var16,(value_type *)__n);
    ptVar3 = *(type **)(puVar11 + 0x14);
    for (ptVar19 = *(type **)(puVar11 + 0x12); ptVar19 != ptVar3; ptVar19 = ptVar19 + 1) {
      tStack_e8 = *ptVar19;
      __n = &tStack_e8;
      sVar8 = std::
              unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
              ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       *)pp_Var16,(key_type *)&tStack_e8);
      if (sVar8 == 0) {
        __n = &tStack_e8;
        std::
        unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  *)local_b8,(value_type *)&tStack_e8);
      }
    }
  }
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::~unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_b8);
  std::__detail::
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>_>_>
  ::_M_deallocate_nodes
            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>_>_>
              *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                liveBlocks._M_h._M_bucket_count,(__node_ptr)&__n->__align);
  std::
  _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_deallocate_buckets
            ((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 numLocals);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count = local_60;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_max_load_factor = _Stack_58._M_max_load_factor;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._4_4_ = _Stack_58._4_4_;
  __node._M_head_impl = (BasicBlock *)queue._M_h._M_single_bucket;
  if ((__node_base_ptr)&_Stack_58._M_next_resize == queue._M_h._M_single_bucket) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
    _M_rehash_policy._M_next_resize = _Stack_58._M_next_resize;
    __node._M_head_impl =
         (BasicBlock *)
         &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks
          ._M_h._M_rehash_policy._M_next_resize;
  }
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = (size_type)local_70._M_nxt;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = p_Stack_68;
  if (local_70._M_nxt != (_Hash_node_base *)0x0) {
    (((_Vector_impl *)&((__node._M_head_impl)->contents).start)->super__Vector_impl_data)._M_start =
         (pointer)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   liveBlocks._M_h._M_bucket_count;
  }
  _Stack_58._M_max_load_factor = 0.0;
  _Stack_58._4_4_ = 0;
  _Stack_58._M_next_resize = 0;
  local_70._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_68 = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ =
       __node._M_head_impl;
  queue._M_h._M_single_bucket = (__node_base_ptr)&_Stack_58._M_next_resize;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::~unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)&queue._M_h._M_single_bucket);
  pp_Var5 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            liveBlocks._M_h._M_buckets;
  queue._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_70._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_68 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               liveBlocks._M_h._M_before_begin._M_nxt;
  local_60 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             liveBlocks._M_h._M_element_count;
  _Stack_58._M_max_load_factor =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
       _M_h._M_rehash_policy._M_max_load_factor;
  _Stack_58._4_4_ =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
       _M_h._M_rehash_policy._4_4_;
  _Stack_58._M_next_resize = 0;
  __arg = (BasicBlock **)
          walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks
          ._M_h._M_buckets;
  queue._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::_M_allocate_buckets
                 ((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&queue._M_h._M_single_bucket,
                  (size_type)
                  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  liveBlocks._M_h._M_buckets);
  plVar21 = (long *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    liveBlocks._M_h._M_bucket_count;
  pBVar24 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  pBVar25 = (BasicBlock *)
            walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
      _M_h._M_bucket_count != 0) {
    local_70._M_nxt =
         &std::__detail::
          _AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,false>>>
          ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,false>>>
                        *)(walker.
                           super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           liveBlocks._M_h._M_bucket_count + 8),__arg)->super__Hash_node_base;
    queue._M_h._M_single_bucket
    [(ulong)(((BasicBlock *)local_70._M_nxt)->contents).start.
            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish % (ulong)pp_Var5]._M_nxt = &local_70;
    _Var9._M_head_impl = (BasicBlock *)local_70._M_nxt;
    __arg_00 = queue._M_h._M_single_bucket;
    while (__node._M_head_impl = _Var9._M_head_impl, plVar21 = (long *)*plVar21,
          pBVar24 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .exit,
          pBVar25 = (BasicBlock *)
                    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .basicBlocks.
                    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, plVar21 != (long *)0x0) {
      _Var9._M_head_impl =
           (BasicBlock *)
           std::__detail::
           _AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,false>>>
           ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,false>>>
                         *)(plVar21 + 1),(BasicBlock **)__arg_00);
      (((_Vector_impl *)&((__node._M_head_impl)->contents).start)->super__Vector_impl_data)._M_start
           = (pointer)_Var9._M_head_impl;
      uVar14 = (ulong)((_Var9._M_head_impl)->contents).start.
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish % (ulong)pp_Var5;
      if (queue._M_h._M_single_bucket[uVar14]._M_nxt == (_Hash_node_base *)0x0) {
        queue._M_h._M_single_bucket[uVar14]._M_nxt = (_Hash_node_base *)__node._M_head_impl;
      }
    }
  }
  do {
    pp_Var16 = &queue._M_h._M_single_bucket;
    if (pBVar24 == pBVar25) {
      std::
      unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::~unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                        *)&queue._M_h._M_single_bucket);
      local_b8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
      queue._M_h._M_buckets = (__buckets_ptr)0x1;
      queue._M_h._M_bucket_count = 0;
      queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      queue._M_h._M_element_count._0_4_ = 0x3f800000;
      queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      queue._M_h._M_rehash_policy._4_4_ = 0;
      queue._M_h._M_rehash_policy._M_next_resize = 0;
      local_38 = (type)walker.
                       super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                       .basicBlocks.
                       super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      ppuVar2 = &live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      for (pBVar25 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                     .
                     super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                     .exit; (type)pBVar25 != local_38;
          pBVar25 = (BasicBlock *)
                    &(pBVar25->contents).start.
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
        tVar22.__align =
             *(anon_struct_8_0_00000001_for___align *)
              &(pBVar25->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data;
        live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)tVar22.__align;
        sVar8 = std::
                unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                         *)&walker.
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            .numLocals,(key_type *)ppuVar2);
        if (sVar8 != 0) {
          uVar14 = (ulong)tVar22 % (ulong)queue._M_h._M_buckets;
          tStack_e8.__align = tVar22.__align;
          p_Var10 = std::
                    _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::_M_find_node((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                    *)local_b8,uVar14,(key_type *)&tStack_e8,
                                   (__hash_code)__node._M_head_impl);
          live_00 = extraout_RDX_00;
          if (p_Var10 == (__node_ptr)0x0) {
            __node._M_head_impl = (BasicBlock *)operator_new(0x10);
            ((__node._M_head_impl)->contents).start.
            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            ((__node._M_head_impl)->contents).start.
            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)tVar22;
            live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_b8;
            std::
            _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_insert_unique_node
                      ((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_b8,uVar14,(__hash_code)tVar22,(__node_ptr)__node._M_head_impl,in_R8)
            ;
            std::
            _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_Scoped_node::~_Scoped_node((_Scoped_node *)ppuVar2);
            tVar22.__align =
                 *(anon_struct_8_0_00000001_for___align *)
                  &(pBVar25->contents).start.
                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data;
            live_00 = extraout_RDX_01;
          }
          LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::
          scanLivenessThroughActions
                    ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                     ((long)tVar22 + 0x30),
                     (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)tVar22,
                     live_00);
        }
      }
      ppuVar2 = &live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      do {
        if (queue._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
          std::
          unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::~unordered_set((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)local_b8);
          walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
              super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule ==
              (Module *)0x0) {
            *(long *)(local_48 + 0x20) = 0;
            *(_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              **)local_48 = local_48 + 0x30;
            *(size_type *)(local_48 + 8) = 1;
            *(_Hash_node_base **)&local_48[0x10].field_0x0 = (_Hash_node_base *)0x0;
            *(size_type *)(local_48 + 0x18) = 0;
            *(float *)&local_48[0x20].field_0x0 = 1.0;
            *(size_t *)(local_48 + 0x28) = 0;
            *(__node_base_ptr *)(local_48 + 0x30) = (__node_base_ptr)0x0;
          }
          else {
            *(_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              **)local_48 = local_48 + 0x30;
            *(size_type *)(local_48 + 8) = 1;
            *(_Hash_node_base **)&local_48[0x10].field_0x0 = (_Hash_node_base *)0x0;
            *(size_type *)(local_48 + 0x18) = 0;
            *(float *)&local_48[0x20].field_0x0 = 1.0;
            *(size_t *)(local_48 + 0x28) = 0;
            *(__node_base_ptr *)(local_48 + 0x30) = (__node_base_ptr)0x0;
            puVar4 = ((walker.
                       super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                       .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                       super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)
                     ->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar26 = ((walker.
                             super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                             .
                             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                             .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                            currModule)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar4;
                puVar26 = (pointer)((long)&(puVar26->_M_t).
                                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                           .super__Head_base<0UL,_wasm::Export_*,_false>.
                                           _M_head_impl + 4)) {
              local_b8._0_4_ =
                   *(undefined4 *)
                    &(puVar26->_M_t).
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              std::__detail::
              _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert(local_48,(value_type *)local_b8);
            }
          }
          LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::~LivenessWalker
                    ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                     auStack_3e8);
          return (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_48;
        }
        __x = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
               (queue._M_h._M_bucket_count + 8);
        std::
        unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)local_b8,(iterator)queue._M_h._M_bucket_count);
        live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tStack_e8 = (type)0x0;
        live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        puVar11 = __x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (__x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar11) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tStack_e8.__align,
                     *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)puVar11);
          puVar11 = __x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar13 = __x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (8 < (ulong)((long)puVar13 - (long)puVar11)) {
            for (uVar14 = 1; uVar14 < (ulong)((long)puVar13 - (long)puVar11 >> 3);
                uVar14 = (ulong)((int)uVar14 + 1)) {
              SortedVector::merge((SortedVector *)ppuVar2,(SortedVector *)&tStack_e8.__align,
                                  *(SortedVector **)(puVar11 + uVar14 * 2));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tStack_e8,ppuVar2);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar2);
              puVar11 = __x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar13 = __x[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
          }
          bVar6 = std::operator!=(__x + 1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          &tStack_e8.__align);
          if (bVar6) {
            if ((ulong)((long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)tStack_e8) <=
                (ulong)((long)__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)__x[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
              __assert_fail("curr->contents.end.size() < live.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                            ,0xf4,
                            "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                           );
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (__x + 1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &tStack_e8.__align);
            LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::
            scanLivenessThroughActions
                      ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                       (__x + 2),
                       (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                       &tStack_e8.__align,live_01);
            bVar6 = std::operator==(__x,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        &tStack_e8.__align);
            if (!bVar6) {
              if ((ulong)((long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)tStack_e8) <=
                  (ulong)((long)(__x->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               )._M_impl.super__Vector_impl_data._M_start)) {
                __assert_fail("curr->contents.start.size() < live.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                              ,0xfc,
                              "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                             );
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (__x,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &tStack_e8.__align);
              puVar13 = __x[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              for (puVar11 = __x[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar13;
                  puVar11 = puVar11 + 2) {
                live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar11;
                std::
                unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)local_b8,(value_type *)ppuVar2);
              }
            }
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&tStack_e8.__align);
      } while( true );
    }
    __node._M_head_impl =
         (BasicBlock *)
         (pBVar24->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_b8 = (undefined1  [8])__node._M_head_impl;
    sVar8 = std::
            unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     *)pp_Var16,(key_type *)local_b8);
    tVar22 = *(type *)((type *)((long)__node._M_head_impl + 0x60))->__data;
    tVar15 = (type)*(type *)&((type *)((long)__node._M_head_impl + 0x68))->__align;
    if (sVar8 == 0) {
      if (tVar15 != tVar22) {
        ((type *)((long)__node._M_head_impl + 0x68))->__align =
             (anon_struct_8_0_00000001_for___align)tVar22;
        __node._M_head_impl =
             (BasicBlock *)
             (pBVar24->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if ((type)(((__node_type *)((long)__node._M_head_impl + 0x50))->super__Hash_node_base)._M_nxt
          != *(type *)((long)__node._M_head_impl + 0x48)) {
        *(type *)((long)__node._M_head_impl + 0x50) = *(type *)((long)__node._M_head_impl + 0x48);
      }
    }
    else {
      lVar17 = (long)tVar15 - (long)tVar22;
      live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pp_Var16;
      local_b8 = (undefined1  [8])pp_Var16;
      local_40 = pBVar24;
      local_38 = tVar15;
      for (lVar20 = lVar17 >> 5; tVar15 = local_38, 0 < lVar20; lVar20 = lVar20 + -1) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )tVar22.__align);
        __first = tVar22;
        tVar15 = local_38;
        if (bVar6) goto LAB_00943888;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(tVar22.__data + 8));
        __first.__data = tVar22.__data + 8;
        tVar15 = local_38;
        if (bVar6) goto LAB_00943888;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(tVar22.__data + 0x10));
        __first.__data = tVar22.__data + 0x10;
        tVar15 = local_38;
        if (bVar6) goto LAB_00943888;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(tVar22.__data + 0x18));
        __first.__data = tVar22.__data + 0x18;
        tVar15 = local_38;
        if (bVar6) goto LAB_00943888;
        tVar22.__data = tVar22.__data + 0x20;
        lVar17 = lVar17 + -0x20;
      }
      lVar17 = lVar17 >> 3;
      if (lVar17 == 1) {
LAB_00943b0f:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )tVar22.__align);
        __first = tVar22;
        if (!bVar6) {
          __first = tVar15;
        }
LAB_00943888:
        pBVar24 = local_40;
        tVar22 = __first;
        if (__first != tVar15) {
          while (__first.__data = __first.__data + 8, __first != tVar15) {
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                    ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                                  *)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                  )__first.__align);
            if (!bVar6) {
              *(BasicBlock **)tVar22 = *(BasicBlock **)__first;
              tVar22.__data = tVar22.__data + 8;
            }
          }
          __first = tVar22;
          tVar15.__align =
               *(type *)&((type *)((long)(pBVar24->contents).start.
                                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 0x68))->__align
          ;
        }
      }
      else {
        if (lVar17 == 2) {
LAB_00943ad3:
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                  ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                                *)local_b8,
                               (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                )tVar22.__align);
          __first = tVar22;
          if (!bVar6) {
            tVar22.__data = tVar22.__data + 8;
            goto LAB_00943b0f;
          }
          goto LAB_00943888;
        }
        __first = local_38;
        pBVar24 = local_40;
        if (lVar17 == 3) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#1}>
                  ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_1_>
                                *)local_b8,
                               (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                                )tVar22.__align);
          __first = tVar22;
          if (!bVar6) {
            tVar22.__data = tVar22.__data + 8;
            goto LAB_00943ad3;
          }
          goto LAB_00943888;
        }
      }
      pp_Var16 = &queue._M_h._M_single_bucket;
      std::
      vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::erase((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               *)((long)__node._M_head_impl + 0x60),(const_iterator)__first.__align,
              (const_iterator)tVar15.__align);
      lVar17 = (long)(pBVar24->contents).start.
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      _Var18._M_current = *(BasicBlock ***)(lVar17 + 0x48);
      local_38 = *(type *)(lVar17 + 0x50);
      lVar20 = (long)local_38 - (long)_Var18._M_current;
      __node._M_head_impl = (BasicBlock *)(lVar17 + 0x48);
      live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pp_Var16;
      local_b8 = (undefined1  [8])pp_Var16;
      for (lVar23 = lVar20 >> 5; pBVar24 = local_40, 0 < lVar23; lVar23 = lVar23 + -1) {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                              *)local_b8,_Var18);
        tVar22 = (type)_Var18._M_current;
        pBVar24 = local_40;
        if (bVar6) goto LAB_00943a75;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(_Var18._M_current + 1));
        tVar22 = (type)(_Var18._M_current + 1);
        pBVar24 = local_40;
        if (bVar6) goto LAB_00943a75;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(_Var18._M_current + 2));
        tVar22 = (type)(_Var18._M_current + 2);
        pBVar24 = local_40;
        if (bVar6) goto LAB_00943a75;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                              *)local_b8,
                             (__normal_iterator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_**,_std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>
                              )(_Var18._M_current + 3));
        tVar22 = (type)(_Var18._M_current + 3);
        pBVar24 = local_40;
        if (bVar6) goto LAB_00943a75;
        _Var18._M_current = _Var18._M_current + 4;
        lVar20 = lVar20 + -0x20;
      }
      lVar20 = lVar20 >> 3;
      if (lVar20 == 1) {
LAB_00943b52:
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                              *)local_b8,_Var18);
        tVar22 = (type)_Var18._M_current;
        if (!bVar6) {
          tVar22 = local_38;
        }
LAB_00943a75:
        tVar15 = local_38;
        _Var18._M_current = (BasicBlock **)tVar22;
        if (tVar22 != local_38) {
          while (_Var18._M_current = _Var18._M_current + 1, (type)_Var18._M_current != local_38) {
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                    ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                                  *)&live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var18);
            if (!bVar6) {
              *(BasicBlock **)tVar22 = *_Var18._M_current;
              tVar22.__data = tVar22.__data + 8;
            }
          }
          tVar15 = (type)*(BasicBlock ***)
                          ((long)(pBVar24->contents).start.
                                 super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 0x50);
        }
      }
      else {
        if (lVar20 == 2) {
LAB_00943af4:
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                  ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                                *)local_b8,_Var18);
          tVar22 = (type)_Var18._M_current;
          if (!bVar6) {
            _Var18._M_current = _Var18._M_current + 1;
            goto LAB_00943b52;
          }
          goto LAB_00943a75;
        }
        tVar15 = local_38;
        tVar22 = local_38;
        if (lVar20 == 3) {
          bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::{lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)#2}>
                  ::operator()((_Iter_pred<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::unlinkDeadBlocks(std::unordered_set<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*,std::hash<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::equal_to<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>,std::allocator<wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*>>)::_lambda(wasm::CFGWalker<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,wasm::Visitor<wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness,void>,wasm::Liveness>::BasicBlock*)_2_>
                                *)local_b8,_Var18);
          tVar22 = (type)_Var18._M_current;
          if (!bVar6) {
            _Var18._M_current = _Var18._M_current + 1;
            goto LAB_00943af4;
          }
          goto LAB_00943a75;
        }
      }
      std::
      vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::erase((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               *)(lVar17 + 0x48),(const_iterator)tVar22.__align,(const_iterator)tVar15.__align);
    }
    pBVar24 = (BasicBlock *)
              &(pBVar24->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

std::unordered_set<Index> getUsedParams(Function* func, Module* module) {
  // To find which params are used, compute liveness at the entry.
  // TODO: We could write bespoke code here rather than reuse LivenessWalker, as
  //       we only need liveness at the entry. The code below computes it for
  //       the param indexes in the entire function. However, there are usually
  //       very few params (compared to locals, which we ignore here), so this
  //       may be fast enough, and is very simple.
  struct ParamLiveness
    : public LivenessWalker<ParamLiveness, Visitor<ParamLiveness>> {
    using Super = LivenessWalker<ParamLiveness, Visitor<ParamLiveness>>;

    // Branches outside of the function can be ignored, as we only look at
    // locals, which vanish when we leave.
    bool ignoreBranchesOutsideOfFunc = true;

    // Ignore unreachable code and non-params.
    static void doVisitLocalGet(ParamLiveness* self, Expression** currp) {
      auto* get = (*currp)->cast<LocalGet>();
      if (self->currBasicBlock && self->getFunction()->isParam(get->index)) {
        Super::doVisitLocalGet(self, currp);
      }
    }
    static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }
  } walker;
  walker.setModule(module);
  walker.walkFunction(func);

  if (!walker.entry) {
    // Empty function: nothing is used.
    return {};
  }

  // We now have a sorted vector of the live params at the entry. Convert that
  // to a set.
  auto& sortedLiveness = walker.entry->contents.start;
  std::unordered_set<Index> usedParams;
  for (auto live : sortedLiveness) {
    usedParams.insert(live);
  }
  return usedParams;
}